

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O1

int If_LogCounterPinDelays
              (int *pTimes,int *pnTimes,word *pPinDels,int Num,word PinDel,int nSuppAll,int fXor)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  word wVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  
  uVar3 = (ulong)*pnTimes;
  iVar8 = *pnTimes + 1;
  pPinDels[uVar3] = PinDel;
  pTimes[uVar3] = Num;
  if (0 < (long)uVar3) {
    do {
      uVar12 = uVar3 & 0xffffffff;
      iVar1 = pTimes[uVar12];
      uVar9 = uVar3 - 1 & 0xffffffff;
      iVar2 = pTimes[uVar9];
      if (iVar1 < iVar2) break;
      iVar11 = (int)uVar3;
      if (iVar2 < iVar1) {
        pTimes[uVar12] = iVar2;
        pTimes[uVar9] = iVar1;
        wVar6 = pPinDels[uVar12];
        pPinDels[uVar12] = pPinDels[uVar9];
        pPinDels[uVar9] = wVar6;
      }
      else {
        pTimes[uVar9] = iVar2 + 1;
        if (nSuppAll < 1) {
          wVar6 = 0;
        }
        else {
          if (nSuppAll - 0x11U < 0xfffffff0) {
            __assert_fail("v >= 0 && v < 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifCount.h"
                          ,0x90,"int If_CutPinDelayGet(word, int)");
          }
          lVar5 = 0;
          wVar6 = 0;
          do {
            bVar4 = (byte)lVar5;
            uVar7 = (uint)(pPinDels[uVar12] >> (bVar4 & 0x3f)) & 0xf;
            uVar10 = (uint)(pPinDels[uVar9] >> (bVar4 & 0x3f)) & 0xf;
            if (uVar10 < uVar7) {
              uVar10 = uVar7;
            }
            if (uVar10 != 0) {
              if (0xd < uVar10) {
                uVar10 = 0xe;
              }
              wVar6 = wVar6 | (ulong)uVar10 + 1 << (bVar4 & 0x3f);
            }
            lVar5 = lVar5 + 4;
          } while ((ulong)(uint)nSuppAll << 2 != lVar5);
        }
        pPinDels[uVar9] = wVar6;
        iVar8 = iVar8 + -1;
        if (iVar11 < iVar8) {
          lVar5 = 0;
          do {
            pTimes[uVar12 + lVar5] = pTimes[uVar12 + lVar5 + 1];
            pPinDels[uVar12 + lVar5] = pPinDels[uVar12 + lVar5 + 1];
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 + iVar11 < iVar8);
        }
      }
      uVar3 = uVar3 - 1;
    } while (1 < iVar11);
  }
  if (iVar8 < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifCount.h"
                  ,0xe2,"int If_LogCounterPinDelays(int *, int *, word *, int, word, int, int)");
  }
  *pnTimes = iVar8;
  return (uint)(iVar8 != 1) + *pTimes;
}

Assistant:

static inline int If_LogCounterPinDelays( int * pTimes, int * pnTimes, word * pPinDels, int Num, word PinDel, int nSuppAll, int fXor )
{
    int nTimes = *pnTimes;
    pPinDels[nTimes] = PinDel;
    pTimes[nTimes++] = Num;
    if ( nTimes > 1 )
    {
        int i, k;
        for ( k = nTimes-1; k > 0; k-- )
        {
            if ( pTimes[k] < pTimes[k-1] )
                break;
            if ( pTimes[k] > pTimes[k-1] )
            { 
                ABC_SWAP( int, pTimes[k], pTimes[k-1] ); 
                ABC_SWAP( word, pPinDels[k], pPinDels[k-1] ); 
                continue; 
            }
            pTimes[k-1] += 1 + fXor;
            pPinDels[k-1] = If_CutPinDelayMax( pPinDels[k], pPinDels[k-1], nSuppAll, 1 + fXor );
            for ( nTimes--, i = k; i < nTimes; i++ )
            {
                pTimes[i] = pTimes[i+1];
                pPinDels[i] = pPinDels[i+1];
            }
        }
    }
    assert( nTimes > 0 );
    *pnTimes = nTimes;
    return pTimes[0] + (nTimes > 1 ? 1 + fXor : 0);
}